

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b12_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined2 uVar4;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar3 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    auVar5 = pmovzxbw(ZEXT416(*(uint *)mask),ZEXT416(*(uint *)mask));
    auVar6._0_2_ = auVar5._0_2_;
    uVar1 = *(ulong *)src0;
    uVar2 = *(undefined8 *)src1;
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar1;
    auVar17._12_2_ = (short)(uVar1 >> 0x30);
    auVar17._14_2_ = (short)((ulong)uVar2 >> 0x30);
    auVar16._12_4_ = auVar17._12_4_;
    auVar16._8_2_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16._10_2_ = (short)((ulong)uVar2 >> 0x20);
    auVar15._10_6_ = auVar16._10_6_;
    auVar15._8_2_ = (short)(uVar1 >> 0x20);
    auVar15._0_8_ = uVar1;
    auVar14._8_8_ = auVar15._8_8_;
    auVar14._6_2_ = (short)((ulong)uVar2 >> 0x10);
    auVar14._4_2_ = (short)(uVar1 >> 0x10);
    auVar14._0_2_ = (undefined2)uVar1;
    auVar14._2_2_ = (short)uVar2;
    auVar9._0_12_ = auVar5._0_12_;
    auVar9._12_2_ = auVar5._6_2_;
    auVar9._14_2_ = auVar3._6_2_ - auVar5._6_2_;
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._0_10_ = auVar5._0_10_;
    auVar8._10_2_ = auVar3._4_2_ - auVar5._4_2_;
    auVar7._10_6_ = auVar8._10_6_;
    auVar7._0_8_ = auVar5._0_8_;
    auVar7._8_2_ = auVar5._4_2_;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6._6_2_ = auVar3._2_2_ - auVar5._2_2_;
    auVar6._4_2_ = auVar5._2_2_;
    auVar6._2_2_ = auVar3._0_2_ - auVar6._0_2_;
    auVar5 = pmaddwd(auVar6,auVar14);
    auVar10._0_4_ = auVar5._0_4_ >> 5;
    auVar10._4_4_ = auVar5._4_4_ >> 5;
    auVar10._8_4_ = auVar5._8_4_ >> 5;
    auVar10._12_4_ = auVar5._12_4_ >> 5;
    auVar5 = packssdw(auVar10,auVar10);
    uVar4 = pavgw(auVar5._0_2_,0);
    uVar11 = pavgw(auVar5._2_2_,0);
    uVar12 = pavgw(auVar5._4_2_,0);
    uVar13 = pavgw(auVar5._6_2_,0);
    pavgw(auVar5._8_2_,0);
    pavgw(auVar5._10_2_,0);
    pavgw(auVar5._12_2_,0);
    pavgw(auVar5._14_2_,0);
    *(ulong *)dst = CONCAT26(uVar13,CONCAT24(uVar12,CONCAT22(uVar11,uVar4)));
    mask = (uint8_t *)((long)mask + (ulong)mask_stride);
    src1 = src1 + src1_stride;
    src0 = (uint16_t *)((long)src0 + (ulong)src0_stride * 2);
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b12_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                              src1_stride, mask, mask_stride, h, blend_4_b12);
}